

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void destroy_stream(quicly_stream_t *stream,int err)

{
  khint_t x;
  int iVar1;
  st_quicly_conn_streamgroup_state_t *psVar2;
  undefined4 in_ESI;
  long *in_RDI;
  st_quicly_conn_streamgroup_state_t *group;
  size_t epoch;
  khiter_t iter;
  quicly_conn_t *conn;
  undefined8 in_stack_ffffffffffffffc8;
  st_quicly_stream_t *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  quicly_conn_t *conn_00;
  
  conn_00 = (quicly_conn_t *)*in_RDI;
  QUICLY_TRACER_STREAM_ON_DESTROY
            ((st_quicly_conn_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  if (in_RDI[2] != 0) {
    (**(code **)in_RDI[2])(in_RDI,in_ESI);
  }
  x = kh_get_quicly_stream_t(conn_00->streams,in_RDI[1]);
  if (x == conn_00->streams->n_buckets) {
    __assert_fail("iter != kh_end(conn->streams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0x462,"void destroy_stream(quicly_stream_t *, int)");
  }
  kh_del_quicly_stream_t(conn_00->streams,x);
  if (in_RDI[1] < 0) {
    *(byte *)(*in_RDI + 0x7bc) =
         *(byte *)(*in_RDI + 0x7bc) & ((byte)(1 << (-((char)in_RDI[1] + '\x01') & 0x1fU)) ^ 0xff);
  }
  else {
    psVar2 = get_streamgroup_state(conn_00,CONCAT44(x,in_stack_ffffffffffffffe0));
    psVar2->num_streams = psVar2->num_streams - 1;
  }
  dispose_stream_properties((quicly_stream_t *)0x14ffc2);
  if (conn_00->application != (st_quicly_application_space_t *)0x0) {
    quicly_stream_is_unidirectional(in_RDI[1]);
    iVar1 = should_send_max_streams(conn_00,x);
    if (iVar1 != 0) {
      (conn_00->egress).send_ack_at = 0;
    }
  }
  free(in_RDI);
  return;
}

Assistant:

static void destroy_stream(quicly_stream_t *stream, int err)
{
    quicly_conn_t *conn = stream->conn;

    QUICLY_PROBE(STREAM_ON_DESTROY, conn, conn->stash.now, stream, err);

    if (stream->callbacks != NULL)
        stream->callbacks->on_destroy(stream, err);

    khiter_t iter = kh_get(quicly_stream_t, conn->streams, stream->stream_id);
    assert(iter != kh_end(conn->streams));
    kh_del(quicly_stream_t, conn->streams, iter);

    if (stream->stream_id < 0) {
        size_t epoch = -(1 + stream->stream_id);
        stream->conn->egress.pending_flows &= ~(uint8_t)(1 << epoch);
    } else {
        struct st_quicly_conn_streamgroup_state_t *group = get_streamgroup_state(conn, stream->stream_id);
        --group->num_streams;
    }

    dispose_stream_properties(stream);

    if (conn->application != NULL) {
        /* The function is normally invoked when receiving a packet, therefore just setting send_ack_at to zero is sufficient to
         * trigger the emission of the MAX_STREAMS frame. FWIW, the only case the function is invoked when not receiving a packet is
         * when the connection is being closed. In such case, the change will not have any bad side effects.
         */
        if (should_send_max_streams(conn, quicly_stream_is_unidirectional(stream->stream_id)))
            conn->egress.send_ack_at = 0;
    }

    free(stream);
}